

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV2LightSettingsBlock(Parser *this,Light *light)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  int local_4c;
  
  local_4c = 0;
LAB_003d45cd:
  do {
    pbVar2 = (byte *)this->filePtr;
    bVar3 = *pbVar2;
    if (bVar3 == 0x2a) {
      this->filePtr = (char *)(pbVar2 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_COLOR",0xb);
      if (bVar1) {
        ParseLV4MeshFloatTriple(this,&(light->mColor).r);
        goto LAB_003d45cd;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_INTENS",0xc);
      if (bVar1) {
        ParseLV4MeshFloat(this,&light->mIntensity);
        goto LAB_003d45cd;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_HOTSPOT",0xd);
      if (bVar1) {
        ParseLV4MeshFloat(this,&light->mAngle);
        goto LAB_003d45cd;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_FALLOFF",0xd);
      if (bVar1) {
        ParseLV4MeshFloat(this,&light->mFalloff);
        goto LAB_003d45cd;
      }
      pbVar2 = (byte *)this->filePtr;
      bVar3 = *pbVar2;
    }
    if ((bVar3 - 0xc < 2) || (bVar3 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003d46d8;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar3 == 0x7b) {
        local_4c = local_4c + 1;
      }
      else if (bVar3 == 0x7d) {
        local_4c = local_4c + -1;
        if (local_4c == 0) {
          this->filePtr = (char *)(pbVar2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar3 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a LIGHT_SETTINGS chunk (Level 2)");
      }
LAB_003d46d8:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar2 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV2LightSettingsBlock(ASE::Light& light)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"LIGHT_COLOR" ,11))
            {
                ParseLV4MeshFloatTriple(&light.mColor.r);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_INTENS" ,12))
            {
                ParseLV4MeshFloat(light.mIntensity);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_HOTSPOT" ,13))
            {
                ParseLV4MeshFloat(light.mAngle);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_FALLOFF" ,13))
            {
                ParseLV4MeshFloat(light.mFalloff);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","LIGHT_SETTINGS");
    }
    return;
}